

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

bool SparseKeyTest<896,Blob<256>>
               (hashfunc<Blob<256>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  undefined7 in_register_00000011;
  char *pcVar2;
  int iVar3;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> hashes;
  vector<Blob<256>,_std::allocator<Blob<256>_>_> local_c8;
  undefined1 local_a8 [64];
  undefined1 auStack_68 [48];
  
  pcVar2 = "exactly";
  iVar3 = (int)CONCAT71(in_register_00000011,inclusive);
  if (iVar3 != 0) {
    pcVar2 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0x380,pcVar2,(ulong)(uint)setbits)
  ;
  local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._0_48_ = SUB6448(ZEXT464(0),0) << 0x40;
  auStack_68 = (undefined1  [48])0x0;
  local_a8._48_16_ = (undefined1  [16])0x0;
  if (iVar3 != 0) {
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::resize(&local_c8,1);
    (*hash.m_hash)(local_a8,0x70,0,
                   local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                   super__Vector_impl_data._M_start);
  }
  SparseKeygenRecurse<Blob<896>,Blob<256>>
            (hash.m_hash,0,setbits,inclusive,(Blob<896> *)local_a8,&local_c8);
  printf("%d keys\n",
         (ulong)((long)local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 5);
  bVar1 = TestHashList<Blob<256>>(&local_c8,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  if (local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.super__Vector_base<Blob<256>,_std::allocator<Blob<256>_>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return bVar1;
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}